

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
::emplace_value<phmap::priv::map_slot_type<int,phmap::test_internal::MovableOnlyInstance>*>
          (btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
           *this,size_type i,allocator_type *alloc,
          map_slot_type<int,_phmap::test_internal::MovableOnlyInstance> **args)

{
  btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
  bVar1;
  map_slot_type<int,_phmap::test_internal::MovableOnlyInstance> *in_RAX;
  ulong uVar2;
  btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
  *c;
  btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
  *pbVar3;
  ulong i_00;
  ulong i_01;
  map_slot_type<int,_phmap::test_internal::MovableOnlyInstance> *local_28;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance>, phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  uVar2 = (ulong)(byte)this[10];
  if (i <= uVar2) {
    local_28 = in_RAX;
    if (i < uVar2) {
      local_28 = (map_slot_type<int,_phmap::test_internal::MovableOnlyInstance> *)
                 (this + uVar2 * 0x18 + -8);
      value_init<phmap::priv::map_slot_type<int,phmap::test_internal::MovableOnlyInstance>*>
                (this,uVar2,alloc,&local_28);
      uVar2 = (ulong)(byte)this[10] - 1;
      if (i < uVar2) {
        pbVar3 = this + (ulong)(byte)this[10] * 0x18 + 8;
        do {
          *(undefined4 *)(pbVar3 + -0x10) = *(undefined4 *)(pbVar3 + -0x28);
          *(undefined8 *)(pbVar3 + -8) = *(undefined8 *)(pbVar3 + -0x20);
          if (*pbVar3 ==
              (btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
               )0x1) {
            test_internal::BaseCountedInstance::num_live_instances_ =
                 test_internal::BaseCountedInstance::num_live_instances_ + -1;
          }
          *pbVar3 = pbVar3[-0x18];
          pbVar3[-0x18] =
               (btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
                )0x0;
          test_internal::BaseCountedInstance::num_moves_ =
               test_internal::BaseCountedInstance::num_moves_ + 1;
          pbVar3 = pbVar3 + -0x18;
          uVar2 = uVar2 - 1;
        } while (i < uVar2);
      }
      btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
      ::value_destroy((btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                       *)this,i,alloc);
    }
    value_init<phmap::priv::map_slot_type<int,phmap::test_internal::MovableOnlyInstance>*>
              (this,i,alloc,args);
    bVar1 = (btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
             )((char)this[10] + 1);
    this[10] = bVar1;
    if (this[0xb] ==
        (btree_node<phmap::priv::map_params<int,phmap::test_internal::MovableOnlyInstance,phmap::Less<int>,std::allocator<std::pair<int_const,phmap::test_internal::MovableOnlyInstance>>,256,false>>
         )0x0) {
      i_00 = i + 1;
      uVar2 = (ulong)(byte)bVar1;
      if (i_00 < (byte)bVar1) {
        while ((int)i_00 < (int)uVar2) {
          i_01 = (ulong)((int)uVar2 - 1);
          c = btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
              ::child((btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                       *)this,i_01);
          btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
          ::set_child((btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                       *)this,uVar2,c);
          uVar2 = i_01;
        }
        btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
        ::mutable_child((btree_node<phmap::priv::map_params<int,_phmap::test_internal::MovableOnlyInstance,_phmap::Less<int>,_std::allocator<std::pair<const_int,_phmap::test_internal::MovableOnlyInstance>_>,_256,_false>_>
                         *)this,i_00);
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::map_params<int, phmap::test_internal::MovableOnlyInstance, phmap::Less<int>, std::allocator<std::pair<const int, phmap::test_internal::MovableOnlyInstance>>, 256, false>, Args = <phmap::priv::map_slot_type<int, phmap::test_internal::MovableOnlyInstance> *>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                             allocator_type *alloc,
                                             Args &&... args) {
        assert(i <= count());
        // Shift old values to create space for new value and then construct it in
        // place.
        if (i < count()) {
            value_init(count(), alloc, slot(count() - 1));
            for (size_type j = count() - 1; j > i; --j)
                params_type::move(alloc, slot(j - 1), slot(j));
            value_destroy(i, alloc);
        }
        value_init(i, alloc, std::forward<Args>(args)...);
        set_count((field_type)(count() + 1));

        if (!leaf() && count() > i + 1) {
            for (int j = count(); j > (int)(i + 1); --j) {
                set_child(j, child(j - 1));
            }
            clear_child(i + 1);
        }
    }